

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

int cf_string_cmp_raw(cf_string_t *self,char *s,cf_size_t s_len)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  uVar3 = (ulong)(*(uint *)self >> 1);
  bVar4 = *self->ptr;
  bVar5 = *s;
  bVar7 = 1 < *(uint *)self;
  bVar8 = s_len != 0;
  if ((bVar7 && bVar8) && bVar4 == bVar5) {
    lVar6 = 0;
    do {
      bVar4 = self->ptr[lVar6 + 1];
      bVar5 = s[lVar6 + 1];
      bVar7 = uVar3 - 1 != lVar6;
      bVar8 = s_len - 1 != lVar6;
      lVar1 = lVar6 + 1;
      if ((bVar4 != bVar5) || (uVar3 - 1 == lVar6)) break;
      bVar9 = s_len - 1 != lVar6;
      lVar6 = lVar1;
    } while (bVar9);
    uVar3 = uVar3 - lVar1;
    s_len = s_len - lVar1;
  }
  uVar2 = 0;
  if (((uVar3 != 0 || s_len != 0) && (uVar2 = 1, !(bool)(bVar7 & s_len == 0))) &&
     (uVar2 = 0xffffffff, !(bool)(bVar8 & uVar3 == 0))) {
    uVar2 = -(uint)(bVar4 < bVar5) | 1;
  }
  return uVar2;
}

Assistant:

int cf_string_cmp_raw(const cf_string_t* self, const char* s, cf_size_t s_len) {
    const char* ptr = self->ptr;
    cf_size_t len = self->len;
    for (; *ptr == *s && len > 0 && s_len > 0; ++ptr, ++s, --len, --s_len);
    if (len == 0 && s_len == 0) return 0;
    if (len > 0 && s_len == 0) return 1;
    if (s_len > 0 && len == 0) return -1;
    return (*CF_TYPE_CAST(cf_uchar_t*, ptr) < *CF_TYPE_CAST(cf_uchar_t*, s) ? -1 : 1);
}